

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O3

int KINSetFuncNormTol(void *kinmem,sunrealtype fnormtol)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar1 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x2e7;
  }
  else {
    if (0.0 <= fnormtol) {
      if ((fnormtol == 0.0) && (!NAN(fnormtol))) {
        fnormtol = (sunrealtype)SUNRpowerR(*(undefined8 *)((long)kinmem + 8),0x3fd5555555555555);
      }
      *(sunrealtype *)((long)kinmem + 0x20) = fnormtol;
      return 0;
    }
    msgfmt = "fnormtol < 0 illegal.";
    iVar1 = -2;
    error_code = -2;
    line = 0x2ef;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINSetFuncNormTol",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int KINSetFuncNormTol(void* kinmem, sunrealtype fnormtol)
{
  KINMem kin_mem;
  sunrealtype uround;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if (fnormtol < ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_FNORMTOL);
    return (KIN_ILL_INPUT);
  }

  if (fnormtol == ZERO)
  {
    uround                = kin_mem->kin_uround;
    kin_mem->kin_fnormtol = SUNRpowerR(uround, ONETHIRD);
  }
  else { kin_mem->kin_fnormtol = fnormtol; }

  return (KIN_SUCCESS);
}